

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ColladaHelper.h
# Opt level: O3

void __thiscall Assimp::Collada::Effect::Effect(Effect *this)

{
  _Rb_tree_header *p_Var1;
  
  this->mShadeType = Shade_Phong;
  (this->mEmissive).r = 0.0;
  (this->mEmissive).g = 0.0;
  (this->mEmissive).b = 0.0;
  (this->mEmissive).a = 1.0;
  (this->mAmbient).r = 0.1;
  (this->mAmbient).g = 0.1;
  (this->mAmbient).b = 0.1;
  (this->mAmbient).a = 1.0;
  (this->mDiffuse).r = 0.6;
  (this->mDiffuse).g = 0.6;
  (this->mDiffuse).b = 0.6;
  (this->mDiffuse).a = 1.0;
  (this->mSpecular).r = 0.4;
  (this->mSpecular).g = 0.4;
  (this->mSpecular).b = 0.4;
  (this->mSpecular).a = 1.0;
  (this->mTransparent).r = 0.0;
  (this->mTransparent).g = 0.0;
  (this->mTransparent).b = 0.0;
  (this->mTransparent).a = 1.0;
  (this->mReflective).r = 0.0;
  (this->mReflective).g = 0.0;
  (this->mReflective).b = 0.0;
  (this->mReflective).a = 0.0;
  (this->mTexEmissive).mName._M_dataplus._M_p = (pointer)&(this->mTexEmissive).mName.field_2;
  (this->mTexEmissive).mName._M_string_length = 0;
  (this->mTexEmissive).mName.field_2._M_local_buf[0] = '\0';
  (this->mTexEmissive).mWrapU = true;
  (this->mTexEmissive).mWrapV = true;
  *(undefined8 *)&(this->mTexEmissive).mMirrorU = 0;
  (this->mTexEmissive).mTransform.mTranslation.x = 0.0;
  (this->mTexEmissive).mTransform.mTranslation.y = 0.0;
  (this->mTexEmissive).mTransform.mScaling.x = 1.0;
  (this->mTexEmissive).mTransform.mScaling.y = 1.0;
  (this->mTexEmissive).mTransform.mRotation = 0.0;
  (this->mTexEmissive).mUVChannel._M_dataplus._M_p =
       (pointer)&(this->mTexEmissive).mUVChannel.field_2;
  (this->mTexEmissive).mUVChannel._M_string_length = 0;
  (this->mTexEmissive).mUVChannel.field_2._M_local_buf[0] = '\0';
  (this->mTexEmissive).mUVId = 0xffffffff;
  (this->mTexEmissive).mWeighting = 1.0;
  (this->mTexEmissive).mMixWithPrevious = 1.0;
  (this->mTexAmbient).mName._M_dataplus._M_p = (pointer)&(this->mTexAmbient).mName.field_2;
  (this->mTexAmbient).mName._M_string_length = 0;
  (this->mTexAmbient).mName.field_2._M_local_buf[0] = '\0';
  (this->mTexAmbient).mWrapU = true;
  (this->mTexAmbient).mWrapV = true;
  (this->mTexAmbient).mTransform.mTranslation.x = 0.0;
  (this->mTexAmbient).mTransform.mTranslation.y = 0.0;
  *(undefined8 *)&(this->mTexAmbient).mMirrorU = 0;
  (this->mTexAmbient).mTransform.mScaling.x = 1.0;
  (this->mTexAmbient).mTransform.mScaling.y = 1.0;
  (this->mTexAmbient).mTransform.mRotation = 0.0;
  (this->mTexAmbient).mUVChannel._M_dataplus._M_p = (pointer)&(this->mTexAmbient).mUVChannel.field_2
  ;
  (this->mTexAmbient).mUVChannel._M_string_length = 0;
  (this->mTexAmbient).mUVChannel.field_2._M_local_buf[0] = '\0';
  (this->mTexAmbient).mUVId = 0xffffffff;
  (this->mTexAmbient).mWeighting = 1.0;
  (this->mTexAmbient).mMixWithPrevious = 1.0;
  (this->mTexDiffuse).mName._M_dataplus._M_p = (pointer)&(this->mTexDiffuse).mName.field_2;
  (this->mTexDiffuse).mName._M_string_length = 0;
  (this->mTexDiffuse).mName.field_2._M_local_buf[0] = '\0';
  (this->mTexDiffuse).mWrapU = true;
  (this->mTexDiffuse).mWrapV = true;
  *(undefined8 *)&(this->mTexDiffuse).mMirrorU = 0;
  (this->mTexDiffuse).mTransform.mTranslation.x = 0.0;
  (this->mTexDiffuse).mTransform.mTranslation.y = 0.0;
  (this->mTexDiffuse).mTransform.mScaling.x = 1.0;
  (this->mTexDiffuse).mTransform.mScaling.y = 1.0;
  (this->mTexDiffuse).mTransform.mRotation = 0.0;
  (this->mTexDiffuse).mUVChannel._M_dataplus._M_p = (pointer)&(this->mTexDiffuse).mUVChannel.field_2
  ;
  (this->mTexDiffuse).mUVChannel._M_string_length = 0;
  (this->mTexDiffuse).mUVChannel.field_2._M_local_buf[0] = '\0';
  (this->mTexDiffuse).mUVId = 0xffffffff;
  (this->mTexDiffuse).mWeighting = 1.0;
  (this->mTexDiffuse).mMixWithPrevious = 1.0;
  (this->mTexSpecular).mName._M_dataplus._M_p = (pointer)&(this->mTexSpecular).mName.field_2;
  (this->mTexSpecular).mName._M_string_length = 0;
  (this->mTexSpecular).mName.field_2._M_local_buf[0] = '\0';
  (this->mTexSpecular).mWrapU = true;
  (this->mTexSpecular).mWrapV = true;
  (this->mTexSpecular).mTransform.mTranslation.x = 0.0;
  (this->mTexSpecular).mTransform.mTranslation.y = 0.0;
  *(undefined8 *)&(this->mTexSpecular).mMirrorU = 0;
  (this->mTexSpecular).mTransform.mScaling.x = 1.0;
  (this->mTexSpecular).mTransform.mScaling.y = 1.0;
  (this->mTexSpecular).mTransform.mRotation = 0.0;
  (this->mTexSpecular).mUVChannel._M_dataplus._M_p =
       (pointer)&(this->mTexSpecular).mUVChannel.field_2;
  (this->mTexSpecular).mUVChannel._M_string_length = 0;
  (this->mTexSpecular).mUVChannel.field_2._M_local_buf[0] = '\0';
  (this->mTexSpecular).mUVId = 0xffffffff;
  (this->mTexSpecular).mWeighting = 1.0;
  (this->mTexSpecular).mMixWithPrevious = 1.0;
  (this->mTexTransparent).mName._M_dataplus._M_p = (pointer)&(this->mTexTransparent).mName.field_2;
  (this->mTexTransparent).mName._M_string_length = 0;
  (this->mTexTransparent).mName.field_2._M_local_buf[0] = '\0';
  (this->mTexTransparent).mWrapU = true;
  (this->mTexTransparent).mWrapV = true;
  (this->mTexTransparent).mTransform.mTranslation.x = 0.0;
  (this->mTexTransparent).mTransform.mTranslation.y = 0.0;
  *(undefined8 *)&(this->mTexTransparent).mMirrorU = 0;
  (this->mTexTransparent).mTransform.mScaling.x = 1.0;
  (this->mTexTransparent).mTransform.mScaling.y = 1.0;
  (this->mTexTransparent).mTransform.mRotation = 0.0;
  (this->mTexTransparent).mUVChannel._M_dataplus._M_p =
       (pointer)&(this->mTexTransparent).mUVChannel.field_2;
  (this->mTexTransparent).mUVChannel._M_string_length = 0;
  (this->mTexTransparent).mUVChannel.field_2._M_local_buf[0] = '\0';
  (this->mTexTransparent).mUVId = 0xffffffff;
  (this->mTexTransparent).mWeighting = 1.0;
  (this->mTexTransparent).mMixWithPrevious = 1.0;
  (this->mTexBump).mName._M_dataplus._M_p = (pointer)&(this->mTexBump).mName.field_2;
  (this->mTexBump).mName._M_string_length = 0;
  (this->mTexBump).mName.field_2._M_local_buf[0] = '\0';
  (this->mTexBump).mWrapU = true;
  (this->mTexBump).mWrapV = true;
  (this->mTexBump).mTransform.mTranslation.x = 0.0;
  (this->mTexBump).mTransform.mTranslation.y = 0.0;
  *(undefined8 *)&(this->mTexBump).mMirrorU = 0;
  (this->mTexBump).mTransform.mScaling.x = 1.0;
  (this->mTexBump).mTransform.mScaling.y = 1.0;
  (this->mTexBump).mTransform.mRotation = 0.0;
  (this->mTexBump).mUVChannel._M_dataplus._M_p = (pointer)&(this->mTexBump).mUVChannel.field_2;
  (this->mTexBump).mUVChannel._M_string_length = 0;
  (this->mTexBump).mUVChannel.field_2._M_local_buf[0] = '\0';
  (this->mTexBump).mUVId = 0xffffffff;
  (this->mTexBump).mWeighting = 1.0;
  (this->mTexBump).mMixWithPrevious = 1.0;
  (this->mTexReflective).mName._M_dataplus._M_p = (pointer)&(this->mTexReflective).mName.field_2;
  (this->mTexReflective).mName._M_string_length = 0;
  (this->mTexReflective).mName.field_2._M_local_buf[0] = '\0';
  (this->mTexReflective).mWrapU = true;
  (this->mTexReflective).mWrapV = true;
  (this->mTexReflective).mTransform.mTranslation.x = 0.0;
  (this->mTexReflective).mTransform.mTranslation.y = 0.0;
  *(undefined8 *)&(this->mTexReflective).mMirrorU = 0;
  (this->mTexReflective).mTransform.mScaling.x = 1.0;
  (this->mTexReflective).mTransform.mScaling.y = 1.0;
  (this->mTexReflective).mTransform.mRotation = 0.0;
  (this->mTexReflective).mUVChannel._M_dataplus._M_p =
       (pointer)&(this->mTexReflective).mUVChannel.field_2;
  (this->mTexReflective).mUVChannel._M_string_length = 0;
  (this->mTexReflective).mUVChannel.field_2._M_local_buf[0] = '\0';
  (this->mTexReflective).mUVId = 0xffffffff;
  (this->mTexReflective).mWeighting = 1.0;
  (this->mTexReflective).mMixWithPrevious = 1.0;
  this->mShininess = 10.0;
  this->mRefractIndex = 1.0;
  this->mReflectivity = 0.0;
  this->mTransparency = 1.0;
  this->mHasTransparency = false;
  this->mRGBTransparency = false;
  this->mInvertTransparency = false;
  p_Var1 = &(this->mParams)._M_t._M_impl.super__Rb_tree_header;
  (this->mParams)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->mParams)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->mParams)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->mParams)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  *(undefined4 *)((long)&(this->mParams)._M_t._M_impl.super__Rb_tree_header._M_node_count + 7) = 0;
  (this->mParams)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  return;
}

Assistant:

Effect()
        : mShadeType    (Shade_Phong)
        , mEmissive     ( 0, 0, 0, 1)
        , mAmbient      ( 0.1f, 0.1f, 0.1f, 1)
        , mDiffuse      ( 0.6f, 0.6f, 0.6f, 1)
        , mSpecular     ( 0.4f, 0.4f, 0.4f, 1)
        , mTransparent  ( 0, 0, 0, 1)
        , mShininess    (10.0f)
        , mRefractIndex (1.f)
        , mReflectivity (0.f)
        , mTransparency (1.f)
        , mHasTransparency (false)
        , mRGBTransparency(false)
        , mInvertTransparency(false)
        , mDoubleSided  (false)
        , mWireframe    (false)
        , mFaceted      (false)
    {
    }